

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plg.cpp
# Opt level: O1

int32 __thiscall
rw::PluginList::registerStream
          (PluginList *this,uint32 id,StreamRead read,StreamWrite write,StreamGetSize getSize)

{
  uint32 uVar1;
  int32 in_EAX;
  LLLink *pLVar2;
  
  pLVar2 = (this->plugins).link.next;
  do {
    if (pLVar2 == &(this->plugins).link) {
      return -1;
    }
    uVar1 = *(uint32 *)&pLVar2[-5].next;
    if (uVar1 == id) {
      pLVar2[-3].next = (LLLink *)read;
      pLVar2[-3].prev = (LLLink *)write;
      pLVar2[-2].next = (LLLink *)getSize;
      in_EAX = *(int32 *)&pLVar2[-6].prev;
    }
    pLVar2 = pLVar2->next;
  } while (uVar1 != id);
  return in_EAX;
}

Assistant:

int32
PluginList::registerStream(uint32 id,
	StreamRead read, StreamWrite write, StreamGetSize getSize)
{
	FORLIST(lnk, this->plugins){
		Plugin *p = PLG(lnk);
		if(p->id == id){
			p->read = read;
			p->write = write;
			p->getSize = getSize;
			return p->offset;
		}
	}
	return -1;
}